

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# charconv_bigint.h
# Opt level: O2

void __thiscall
absl::lts_20240722::strings_internal::BigUnsigned<84>::MultiplyByFiveToTheNth
          (BigUnsigned<84> *this,int n)

{
  ulong uVar1;
  
  for (uVar1 = (ulong)(uint)n; 0xc < (int)uVar1; uVar1 = uVar1 - 0xd) {
    MultiplyBy(this,0x48c27395);
  }
  if (0 < (int)uVar1) {
    MultiplyBy(this,*(uint32_t *)(kFiveToNth + uVar1 * 4));
    return;
  }
  return;
}

Assistant:

void MultiplyByFiveToTheNth(int n) {
    while (n >= kMaxSmallPowerOfFive) {
      MultiplyBy(kFiveToNth[kMaxSmallPowerOfFive]);
      n -= kMaxSmallPowerOfFive;
    }
    if (n > 0) {
      MultiplyBy(kFiveToNth[n]);
    }
  }